

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

bool __thiscall QTreeView::isIndexHidden(QTreeView *this,QModelIndex *index)

{
  int row;
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isColumnHidden(this,index->c);
  bVar2 = true;
  if (!bVar1) {
    row = index->r;
    QModelIndex::parent(&local_40,index);
    bVar2 = isRowHidden(this,row,&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::isIndexHidden(const QModelIndex &index) const
{
    return (isColumnHidden(index.column()) || isRowHidden(index.row(), index.parent()));
}